

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O0

qint64 __thiscall
QHttpSocketEngine::writeDatagram
          (QHttpSocketEngine *this,char *param_2,qint64 param_3,QIpPacketHeader *param_4)

{
  QLatin1StringView latin1;
  qsizetype in_RCX;
  char *in_RDX;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar1;
  char *file;
  SocketError error;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = 0;
  file = local_28;
  QMessageLogger::QMessageLogger(in_RDI,file,0,in_stack_ffffffffffffff68);
  QMessageLogger::warning(file,"Operation is not supported");
  Qt::Literals::StringLiterals::operator____L1(file,CONCAT44(uVar1,in_stack_ffffffffffffff70));
  error = (SocketError)((ulong)file >> 0x20);
  latin1.m_data = in_RDX;
  latin1.m_size = in_RCX;
  QString::QString((QString *)in_RDI,latin1);
  QAbstractSocketEngine::setError
            ((QAbstractSocketEngine *)in_RDI,error,
             (QString *)CONCAT44(uVar1,in_stack_ffffffffffffff70));
  QString::~QString((QString *)0x33a1bb);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return -1;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QHttpSocketEngine::writeDatagram(const char *, qint64, const QIpPacketHeader &)
{
    qWarning("Operation is not supported");
    setError(QAbstractSocket::UnsupportedSocketOperationError, "Unsupported socket operation"_L1);
    return -1;
}